

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

void __thiscall czh::lexer::Lexer::reset(Lexer *this)

{
  Pos local_80;
  Token local_60;
  Lexer *local_10;
  Lexer *this_local;
  
  this->is_eof = false;
  local_10 = this;
  czh::token::Pos::Pos(&local_80,&this->codepos);
  czh::token::Token::Token<int>(&local_60,UNEXPECTED,0,&local_80);
  czh::token::Token::operator=(&this->buffer,&local_60);
  czh::token::Token::~Token(&local_60);
  czh::token::Pos::~Pos(&local_80);
  Match::reset(&this->match);
  NumberMatch::reset(&this->nmatch);
  czh::token::Pos::reset(&this->codepos);
  return;
}

Assistant:

void reset()
    {
      is_eof = false;
      buffer = token::Token{token::TokenType::UNEXPECTED, 0, codepos};
      match.reset();
      nmatch.reset();
      codepos.reset();
    }